

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::DecompressInternal
          (ColumnReader *this,type codec,const_data_ptr_t src,idx_t src_size,data_ptr_t dst,
          idx_t dst_size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  BrotliDecoderResult BVar5;
  size_t code;
  BrotliDecoderStateInternal *s;
  InternalException *this_00;
  runtime_error *prVar6;
  long *plVar7;
  long *plVar8;
  unsigned_long src_size_size_t;
  unsigned_long dst_size_size_t;
  size_t uncompressed_size;
  type local_21c;
  data_ptr_t local_218;
  const_data_ptr_t local_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 local_188;
  mz_ulong mStack_180;
  char *local_178;
  mz_internal_state *pmStack_170;
  mz_alloc_func local_168;
  mz_free_func p_Stack_160;
  void *local_158;
  undefined8 uStack_150;
  mz_ulong local_148;
  mz_ulong mStack_140;
  MiniZStreamType local_138;
  
  local_21c = codec;
  local_218 = dst;
  local_210 = src;
  switch(codec) {
  case UNCOMPRESSED:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = local_1a8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Parquet data unexpectedly uncompressed","");
    InternalException::InternalException(this_00,(string *)local_1a8);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case SNAPPY:
    local_1a8._0_8_ = (uchar *)0x0;
    bVar1 = duckdb_snappy::GetUncompressedLength((char *)src,src_size,(size_t *)local_1a8);
    if (bVar1) {
      if (local_1a8._0_8_ == dst_size) {
        bVar1 = duckdb_snappy::RawUncompress((char *)local_210,src_size,(char *)local_218);
        if (bVar1) {
          return;
        }
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(prVar6,"Snappy decompression failure");
      }
      else {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar6,"Snappy decompression failure: Uncompressed data size mismatch");
      }
    }
    else {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar6,"Snappy decompression failure");
    }
    break;
  case GZIP:
    local_148 = 0;
    mStack_140 = 0;
    local_158 = (void *)0x0;
    uStack_150._0_4_ = 0;
    uStack_150._4_4_ = 0;
    local_168 = (mz_alloc_func)0x0;
    p_Stack_160 = (mz_free_func)0x0;
    local_178 = (char *)0x0;
    pmStack_170 = (mz_internal_state *)0x0;
    local_188._0_4_ = 0;
    local_188._4_4_ = 0;
    mStack_180 = 0;
    local_198._M_allocated_capacity = 0;
    local_198._8_8_ = (uchar *)0x0;
    local_1a8._0_8_ = (uchar *)0x0;
    local_1a8._8_8_ = 0;
    local_138 = MINIZ_TYPE_NONE;
    MiniZStream::Decompress((MiniZStream *)local_1a8,(char *)src,src_size,(char *)dst,dst_size);
    MiniZStream::~MiniZStream((MiniZStream *)local_1a8);
    return;
  default:
    ::std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    duckdb_parquet::operator<<((ostream *)(local_1a8 + 0x10),&local_21c);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::stringbuf::str();
    ::std::operator+(&local_1e8,"Unsupported compression codec \"",&local_1c8);
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_1e8);
    local_208 = (long *)*plVar7;
    plVar8 = plVar7 + 2;
    if (local_208 == plVar8) {
      local_1f8 = *plVar8;
      lStack_1f0 = plVar7[3];
      local_208 = &local_1f8;
    }
    else {
      local_1f8 = *plVar8;
    }
    local_200 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ::std::runtime_error::runtime_error(prVar6,(string *)&local_208);
    __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  case BROTLI:
    s = duckdb_brotli::BrotliDecoderCreateInstance
                  ((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    local_1a8._0_8_ = (uchar *)0x0;
    local_208 = (long *)src_size;
    local_1e8._M_dataplus._M_p = (pointer)dst_size;
    BVar5 = duckdb_brotli::BrotliDecoderDecompressStream
                      (s,(size_t *)&local_208,&local_210,(size_t *)&local_1e8,&local_218,
                       (size_t *)local_1a8);
    if (BVar5 == BROTLI_DECODER_RESULT_SUCCESS) {
      duckdb_brotli::BrotliDecoderDestroyInstance(s);
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"Brotli Decompression failure");
    break;
  case ZSTD:
    code = duckdb_zstd::ZSTD_decompress(dst,dst_size,src,src_size);
    uVar4 = duckdb_zstd::ZSTD_isError(code);
    if ((code == dst_size) && (uVar4 == 0)) {
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"ZSTD Decompression failure");
    break;
  case LZ4_RAW:
    iVar2 = duckdb_lz4::LZ4_decompress_safe((char *)src,(char *)dst,(int)src_size,(int)dst_size);
    iVar3 = NumericCastImpl<int,_unsigned_long,_false>::Convert(dst_size);
    if (iVar2 == iVar3) {
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"LZ4 decompression failure");
  }
  __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnReader::DecompressInternal(CompressionCodec::type codec, const_data_ptr_t src, idx_t src_size,
                                      data_ptr_t dst, idx_t dst_size) {
	switch (codec) {
	case CompressionCodec::UNCOMPRESSED:
		throw InternalException("Parquet data unexpectedly uncompressed");
	case CompressionCodec::GZIP: {
		MiniZStream s;
		s.Decompress(const_char_ptr_cast(src), src_size, char_ptr_cast(dst), dst_size);
		break;
	}
	case CompressionCodec::LZ4_RAW: {
		auto res =
		    duckdb_lz4::LZ4_decompress_safe(const_char_ptr_cast(src), char_ptr_cast(dst),
		                                    UnsafeNumericCast<int32_t>(src_size), UnsafeNumericCast<int32_t>(dst_size));
		if (res != NumericCast<int>(dst_size)) {
			throw std::runtime_error("LZ4 decompression failure");
		}
		break;
	}
	case CompressionCodec::SNAPPY: {
		{
			size_t uncompressed_size = 0;
			auto res = duckdb_snappy::GetUncompressedLength(const_char_ptr_cast(src), src_size, &uncompressed_size);
			if (!res) {
				throw std::runtime_error("Snappy decompression failure");
			}
			if (uncompressed_size != dst_size) {
				throw std::runtime_error("Snappy decompression failure: Uncompressed data size mismatch");
			}
		}
		auto res = duckdb_snappy::RawUncompress(const_char_ptr_cast(src), src_size, char_ptr_cast(dst));
		if (!res) {
			throw std::runtime_error("Snappy decompression failure");
		}
		break;
	}
	case CompressionCodec::ZSTD: {
		auto res = duckdb_zstd::ZSTD_decompress(dst, dst_size, src, src_size);
		if (duckdb_zstd::ZSTD_isError(res) || res != dst_size) {
			throw std::runtime_error("ZSTD Decompression failure");
		}
		break;
	}
	case CompressionCodec::BROTLI: {
		auto state = duckdb_brotli::BrotliDecoderCreateInstance(nullptr, nullptr, nullptr);
		size_t total_out = 0;
		auto src_size_size_t = NumericCast<size_t>(src_size);
		auto dst_size_size_t = NumericCast<size_t>(dst_size);

		auto res = duckdb_brotli::BrotliDecoderDecompressStream(state, &src_size_size_t, &src, &dst_size_size_t, &dst,
		                                                        &total_out);
		if (res != duckdb_brotli::BROTLI_DECODER_RESULT_SUCCESS) {
			throw std::runtime_error("Brotli Decompression failure");
		}
		duckdb_brotli::BrotliDecoderDestroyInstance(state);
		break;
	}

	default: {
		std::stringstream codec_name;
		codec_name << codec;
		throw std::runtime_error("Unsupported compression codec \"" + codec_name.str() +
		                         "\". Supported options are uncompressed, brotli, gzip, lz4_raw, snappy or zstd");
	}
	}
}